

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O0

shared_ptr<MyCompiler::Ident> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Ident>(RecursiveDescentParser *this)

{
  string *psVar1;
  element_type *peVar2;
  socklen_t *in_RCX;
  sockaddr *__addr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::Ident> sVar3;
  allocator local_41;
  string local_40 [39];
  undefined1 local_19;
  RecursiveDescentParser *this_local;
  shared_ptr<MyCompiler::Ident> *pResult;
  
  local_19 = 0;
  this_local = this;
  std::make_shared<MyCompiler::Ident>();
  if (in_RSI->sym != IDENT) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"identifier expected",&local_41);
    except(in_RSI,IDENT,(string *)local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  psVar1 = Token::getValue_abi_cxx11_(&in_RSI->currentToken);
  peVar2 = std::__shared_ptr_access<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::__cxx11::string::operator=((string *)&(peVar2->super_AbstractAstNode).value,(string *)psVar1)
  ;
  accept(in_RSI,in_RSI->sym,__addr,in_RCX);
  sVar3.super___shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::Ident>)
         sVar3.super___shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::Ident> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Ident>();

    if (sym != SymbolType::IDENT)
        except(SymbolType::IDENT, "identifier expected");
    pResult->value = currentToken.getValue();
    accept(sym);

    return pResult;
}